

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansicolor_sink-inl.h
# Opt level: O0

double __thiscall
spdlog::sinks::ansicolor_sink<spdlog::details::console_mutex>::log
          (ansicolor_sink<spdlog::details::console_mutex> *this,double __x)

{
  pointer pfVar1;
  long in_RSI;
  double extraout_XMM0_Qa;
  memory_buf_t formatted;
  lock_guard<std::mutex> lock;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe68;
  basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *in_stack_fffffffffffffe70;
  memory_buf_t *pmVar2;
  memory_buf_t *in_stack_fffffffffffffe78;
  ansicolor_sink<spdlog::details::console_mutex> *in_stack_fffffffffffffe80;
  ansicolor_sink<spdlog::details::console_mutex> *this_00;
  memory_buf_t local_138;
  long local_10;
  ansicolor_sink<spdlog::details::console_mutex> *local_8;
  
  local_10 = in_RSI;
  local_8 = this;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_fffffffffffffe70,
             (mutex_type *)in_stack_fffffffffffffe68);
  *(undefined8 *)(local_10 + 0x28) = 0;
  *(undefined8 *)(local_10 + 0x30) = 0;
  ::fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>::
  basic_memory_buffer(in_stack_fffffffffffffe70,(allocator<char> *)in_stack_fffffffffffffe68);
  pfVar1 = std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::operator->
                     ((unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)
                      0x18025a);
  (*pfVar1->_vptr_formatter[2])(pfVar1,local_10,&local_138);
  if (((this->should_do_colors_ & 1U) == 0) ||
     (*(ulong *)(local_10 + 0x30) <= *(ulong *)(local_10 + 0x28))) {
    pmVar2 = &local_138;
    ::fmt::v11::detail::buffer<char>::size(&pmVar2->super_buffer<char>);
    print_range_(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,(size_t)pmVar2,
                 (size_t)in_stack_fffffffffffffe68);
  }
  else {
    print_range_(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                 (size_t)in_stack_fffffffffffffe70,(size_t)in_stack_fffffffffffffe68);
    std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_7UL>
    ::at((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_7UL>
          *)in_stack_fffffffffffffe70,(size_type)in_stack_fffffffffffffe68);
    ::fmt::v11::basic_string_view<char>::
    basic_string_view<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string_view<char> *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    print_ccode_(in_stack_fffffffffffffe80,(string_view_t *)in_stack_fffffffffffffe78);
    print_range_(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                 (size_t)in_stack_fffffffffffffe70,(size_t)in_stack_fffffffffffffe68);
    print_ccode_(in_stack_fffffffffffffe80,(string_view_t *)in_stack_fffffffffffffe78);
    this_00 = *(ansicolor_sink<spdlog::details::console_mutex> **)(local_10 + 0x30);
    pmVar2 = &local_138;
    ::fmt::v11::detail::buffer<char>::size(&pmVar2->super_buffer<char>);
    print_range_(this_00,pmVar2,(size_t)in_stack_fffffffffffffe70,(size_t)in_stack_fffffffffffffe68)
    ;
  }
  fflush((FILE *)this->target_file_);
  ::fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>::
  ~basic_memory_buffer
            ((basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *)0x1803ee);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1803fb);
  return extraout_XMM0_Qa;
}

Assistant:

SPDLOG_INLINE void ansicolor_sink<ConsoleMutex>::log(const details::log_msg &msg) {
    // Wrap the originally formatted message in color codes.
    // If color is not supported in the terminal, log as is instead.
    std::lock_guard<mutex_t> lock(mutex_);
    msg.color_range_start = 0;
    msg.color_range_end = 0;
    memory_buf_t formatted;
    formatter_->format(msg, formatted);
    if (should_do_colors_ && msg.color_range_end > msg.color_range_start) {
        // before color range
        print_range_(formatted, 0, msg.color_range_start);
        // in color range
        print_ccode_(colors_.at(static_cast<size_t>(msg.level)));
        print_range_(formatted, msg.color_range_start, msg.color_range_end);
        print_ccode_(reset);
        // after color range
        print_range_(formatted, msg.color_range_end, formatted.size());
    } else  // no color
    {
        print_range_(formatted, 0, formatted.size());
    }
    fflush(target_file_);
}